

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  sqlite3 *db;
  sqlite3_xauth p_Var4;
  int iVar5;
  uint uVar6;
  RenameToken *pToken_1;
  char *pcVar7;
  char *zSql;
  char *zName;
  char *zNew;
  i64 iVar8;
  RenameToken *pRVar9;
  TriggerStep *pTVar10;
  int iVar11;
  RenameToken *pToken_2;
  FKey *pFVar12;
  long lVar13;
  RenameToken **ppRVar14;
  undefined1 auVar15 [8];
  RenameToken *pToken_4;
  RenameToken *pRVar16;
  SrcList *pSVar17;
  RenameToken *pToken;
  long lVar18;
  RenameToken *pRVar19;
  long in_FS_OFFSET;
  NameContext sNC;
  Walker sWalker;
  Parse sParse;
  NameContext local_278;
  undefined1 local_238 [32];
  undefined8 local_218;
  anon_union_8_18_67db040d_for_u aStack_210;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  Table *local_1f8;
  char *pcStack_1f0;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  pcVar7 = (char *)sqlite3ValueText(*argv,'\x01');
  zSql = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  zNew = (char *)sqlite3ValueText(argv[5],'\x01');
  iVar8 = sqlite3VdbeIntValue(argv[6]);
  if (zNew == (char *)0x0 || (zName == (char *)0x0 || zSql == (char *)0x0)) goto LAB_001b3084;
  memset(&local_1e0,0xaa,0x1a8);
  local_1f8 = (Table *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_208 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  uStack_200 = &DAT_aaaaaaaaaaaaaaaa;
  local_218 = &DAT_aaaaaaaaaaaaaaaa;
  aStack_210.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  local_238._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_238._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_238._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_238._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  p_Var4 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  local_1f8 = (Table *)0x0;
  pcStack_1f0 = (char *)0x0;
  local_208 = (undefined1  [8])0x0;
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  local_1f8 = sqlite3FindTable(db,zName,pcVar7);
  local_238._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_218._0_4_ = 0;
  local_218._4_2_ = 0;
  local_218._6_2_ = 0;
  local_238._8_8_ = renameTableExprCb;
  local_238._16_8_ = renameTableSelectCb;
  local_238._0_8_ = &local_1e0;
  aStack_210.pNC = (NameContext *)local_208;
  iVar5 = renameParseSql(&local_1e0,pcVar7,db,zSql,(int)iVar8);
  if (iVar5 == 0) {
    uVar6 = (uint)db->flags;
    if (local_1e0.pNewTable == (Table *)0x0) {
      if (local_1e0.pNewIndex == (Index *)0x0) {
        pcVar7 = (local_1e0.pNewTrigger)->table;
        if (pcVar7 != (char *)0x0) {
          lVar13 = 0;
          do {
            bVar2 = pcVar7[lVar13];
            if (bVar2 == zName[lVar13]) {
              if ((ulong)bVar2 == 0) goto LAB_001b3359;
            }
            else if (""[bVar2] != ""[(byte)zName[lVar13]]) break;
            lVar13 = lVar13 + 1;
          } while( true );
        }
        goto LAB_001b33ff;
      }
      pcVar7 = (local_1e0.pNewIndex)->zName;
      if (local_1e0.pRename != (RenameToken *)0x0 && pcVar7 != (char *)0x0) {
        if ((char *)(local_1e0.pRename)->p == pcVar7) {
          ppRVar14 = &local_1e0.pRename;
          pRVar9 = local_1e0.pRename;
        }
        else {
          do {
            pRVar9 = local_1e0.pRename;
            local_1e0.pRename = pRVar9->pNext;
            if (local_1e0.pRename == (RenameToken *)0x0) goto LAB_001b3328;
          } while ((char *)(local_1e0.pRename)->p != pcVar7);
          ppRVar14 = &pRVar9->pNext;
          pRVar9 = local_1e0.pRename;
        }
        *ppRVar14 = pRVar9->pNext;
        pRVar9->pNext = (RenameToken *)local_208;
        uStack_200._0_4_ = (int)uStack_200 + 1;
        local_208 = (undefined1  [8])pRVar9;
      }
LAB_001b3328:
      iVar5 = 0;
      if (((uVar6 >> 0x1a & 1) == 0) && ((local_1e0.pNewIndex)->pPartIdxWhere != (Expr *)0x0)) {
        sqlite3WalkExprNN((Walker *)local_238,(local_1e0.pNewIndex)->pPartIdxWhere);
      }
    }
    else if ((local_1e0.pNewTable)->eTabType == '\x02') {
      iVar5 = 0;
      if ((uVar6 >> 0x1a & 1) == 0) {
        local_278.pSrcList = (SrcList *)0x0;
        local_278.uNC.pEList = (ExprList *)0x0;
        local_278.pNext = (NameContext *)0x0;
        local_278.nRef = 0;
        local_278.nNcErr = 0;
        local_278.ncFlags = 0;
        local_278.nNestedSelect = 0;
        local_278.pWinSelect = (Select *)0x0;
        pbVar1 = (byte *)((long)&(((local_1e0.pNewTable)->u).view.pSelect)->selFlags + 2);
        *pbVar1 = *pbVar1 & 0xdf;
        local_278.pParse = &local_1e0;
        sqlite3SelectPrep(&local_1e0,((local_1e0.pNewTable)->u).view.pSelect,&local_278);
        iVar5 = local_1e0.rc;
        if (local_1e0.nErr == 0) {
          sqlite3WalkSelect((Walker *)local_238,((local_1e0.pNewTable)->u).view.pSelect);
          iVar5 = 0;
        }
      }
    }
    else {
      if (((((byte)(db->flags >> 0x1a) & 0x3f & (uVar6 >> 0xe & 1) == 0) == 0) &&
          ((local_1e0.pNewTable)->eTabType != '\x01')) &&
         (pFVar12 = ((local_1e0.pNewTable)->u).tab.pFKey, pFVar12 != (FKey *)0x0)) {
        auVar15 = local_208;
        iVar5 = (int)uStack_200;
LAB_001b3156:
        pcVar7 = pFVar12->zTo;
        if (pcVar7 != (char *)0x0) {
          lVar13 = 0;
          do {
            bVar2 = pcVar7[lVar13];
            if (bVar2 == zName[lVar13]) {
              if ((ulong)bVar2 == 0) goto LAB_001b318c;
            }
            else if (""[bVar2] != ""[(byte)zName[lVar13]]) break;
            lVar13 = lVar13 + 1;
          } while( true );
        }
        goto LAB_001b31e3;
      }
LAB_001b31f0:
      if ((local_1e0.pNewTable)->zName != (char *)0x0) {
        lVar13 = 0;
        do {
          bVar2 = zName[lVar13];
          bVar3 = (local_1e0.pNewTable)->zName[lVar13];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001b327d;
          }
          else if (""[bVar2] != ""[bVar3]) break;
          lVar13 = lVar13 + 1;
        } while( true );
      }
      iVar5 = 0;
    }
  }
  goto LAB_001b2f22;
LAB_001b3359:
  if ((local_1f8->pSchema == (local_1e0.pNewTrigger)->pTabSchema) &&
     (local_1e0.pRename != (RenameToken *)0x0 && pcVar7 != (char *)0x0)) {
    pRVar9 = local_1e0.pRename;
    if ((char *)(local_1e0.pRename)->p == pcVar7) {
      ppRVar14 = &local_1e0.pRename;
    }
    else {
      do {
        pRVar19 = pRVar9;
        pRVar9 = pRVar19->pNext;
        if (pRVar9 == (RenameToken *)0x0) goto LAB_001b33ff;
      } while ((char *)pRVar9->p != pcVar7);
      ppRVar14 = &pRVar19->pNext;
    }
    *ppRVar14 = pRVar9->pNext;
    pRVar9->pNext = (RenameToken *)local_208;
    uStack_200._0_4_ = (int)uStack_200 + 1;
    local_208 = (undefined1  [8])pRVar9;
  }
LAB_001b33ff:
  iVar5 = 0;
  if (((uVar6 >> 0x1a & 1) == 0) && (iVar5 = renameResolveTrigger(&local_1e0), iVar5 == 0)) {
    renameWalkTrigger((Walker *)local_238,local_1e0.pNewTrigger);
    pTVar10 = (local_1e0.pNewTrigger)->step_list;
    iVar5 = 0;
    if (pTVar10 != (TriggerStep *)0x0) {
      auVar15 = local_208;
      iVar11 = (int)uStack_200;
LAB_001b3460:
      pcVar7 = pTVar10->zTarget;
      pRVar9 = (RenameToken *)auVar15;
      if (pcVar7 != (char *)0x0) {
        lVar13 = 0;
        do {
          bVar2 = pcVar7[lVar13];
          bVar3 = zName[lVar13];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001b3496;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_001b3496;
          lVar13 = lVar13 + 1;
        } while( true );
      }
      goto LAB_001b34ed;
    }
  }
  goto LAB_001b2f22;
LAB_001b3496:
  if (local_1e0.pRename != (RenameToken *)0x0 && bVar2 == bVar3) {
    pRVar19 = local_1e0.pRename;
    pRVar9 = local_1e0.pRename;
    ppRVar14 = &local_1e0.pRename;
    if ((char *)(local_1e0.pRename)->p != pcVar7) {
      do {
        pRVar16 = pRVar19;
        pRVar19 = pRVar16->pNext;
        pRVar9 = (RenameToken *)auVar15;
        if (pRVar19 == (RenameToken *)0x0) goto LAB_001b34ed;
      } while ((char *)pRVar19->p != pcVar7);
      ppRVar14 = &pRVar16->pNext;
      pRVar9 = pRVar19;
    }
    *ppRVar14 = pRVar9->pNext;
    pRVar9->pNext = (RenameToken *)auVar15;
    iVar11 = iVar11 + 1;
    uStack_200._0_4_ = iVar11;
    local_208 = (undefined1  [8])pRVar9;
  }
LAB_001b34ed:
  if ((pTVar10->pFrom != (SrcList *)0x0) && (pSVar17 = pTVar10->pFrom, 0 < pSVar17->nSrc)) {
    lVar13 = 0;
LAB_001b3509:
    pcVar7 = pSVar17->a[lVar13].zName;
    if (pcVar7 != (char *)0x0) {
      lVar18 = 0;
      do {
        bVar2 = pcVar7[lVar18];
        if (bVar2 == zName[lVar18]) {
          if ((ulong)bVar2 == 0) goto LAB_001b3544;
        }
        else if (""[bVar2] != ""[(byte)zName[lVar18]]) break;
        lVar18 = lVar18 + 1;
      } while( true );
    }
    goto LAB_001b359b;
  }
LAB_001b35ae:
  pTVar10 = pTVar10->pNext;
  auVar15 = (undefined1  [8])pRVar9;
  iVar5 = 0;
  if (pTVar10 == (TriggerStep *)0x0) goto LAB_001b2f22;
  goto LAB_001b3460;
LAB_001b3544:
  if (local_1e0.pRename != (RenameToken *)0x0 && pcVar7 != (char *)0x0) {
    pRVar19 = local_1e0.pRename;
    ppRVar14 = &local_1e0.pRename;
    if ((char *)(local_1e0.pRename)->p != pcVar7) {
      do {
        pRVar16 = pRVar19;
        pRVar19 = pRVar16->pNext;
        if (pRVar19 == (RenameToken *)0x0) goto LAB_001b359b;
      } while ((char *)pRVar19->p != pcVar7);
      ppRVar14 = &pRVar16->pNext;
    }
    *ppRVar14 = pRVar19->pNext;
    pRVar19->pNext = pRVar9;
    iVar11 = iVar11 + 1;
    uStack_200._0_4_ = iVar11;
    pRVar9 = pRVar19;
    local_208 = (undefined1  [8])pRVar19;
  }
LAB_001b359b:
  lVar13 = lVar13 + 1;
  pSVar17 = pTVar10->pFrom;
  if (pSVar17->nSrc <= lVar13) goto LAB_001b35ae;
  goto LAB_001b3509;
LAB_001b318c:
  if (local_1e0.pRename != (RenameToken *)0x0 && pcVar7 != (char *)0x0) {
    pRVar9 = local_1e0.pRename;
    ppRVar14 = &local_1e0.pRename;
    if ((char *)(local_1e0.pRename)->p != pcVar7) {
      do {
        pRVar19 = pRVar9;
        pRVar9 = pRVar19->pNext;
        if (pRVar9 == (RenameToken *)0x0) goto LAB_001b31e3;
      } while ((char *)pRVar9->p != pcVar7);
      ppRVar14 = &pRVar19->pNext;
    }
    *ppRVar14 = pRVar9->pNext;
    pRVar9->pNext = (RenameToken *)auVar15;
    iVar5 = iVar5 + 1;
    uStack_200._0_4_ = iVar5;
    auVar15 = (undefined1  [8])pRVar9;
    local_208 = (undefined1  [8])pRVar9;
  }
LAB_001b31e3:
  pFVar12 = pFVar12->pNextFrom;
  if (pFVar12 == (FKey *)0x0) goto LAB_001b31f0;
  goto LAB_001b3156;
LAB_001b327d:
  local_1f8 = local_1e0.pNewTable;
  if ((uVar6 >> 0x1a & 1) == 0) {
    sqlite3WalkExprList((Walker *)local_238,(local_1e0.pNewTable)->pCheck);
  }
  pcVar7 = (local_1e0.pNewTable)->zName;
  iVar5 = 0;
  if (local_1e0.pRename != (RenameToken *)0x0 && pcVar7 != (char *)0x0) {
    if ((char *)(local_1e0.pRename)->p == pcVar7) {
      ppRVar14 = &local_1e0.pRename;
      pRVar9 = local_1e0.pRename;
    }
    else {
      do {
        pRVar9 = local_1e0.pRename;
        local_1e0.pRename = pRVar9->pNext;
        iVar5 = 0;
        if (local_1e0.pRename == (RenameToken *)0x0) goto LAB_001b2f22;
      } while ((char *)(local_1e0.pRename)->p != pcVar7);
      ppRVar14 = &pRVar9->pNext;
      pRVar9 = local_1e0.pRename;
    }
    *ppRVar14 = pRVar9->pNext;
    pRVar9->pNext = (RenameToken *)local_208;
    uStack_200._0_4_ = (int)uStack_200 + 1;
    iVar5 = 0;
    local_208 = (undefined1  [8])pRVar9;
  }
LAB_001b2f22:
  if (iVar5 == 0) {
    iVar5 = renameEditSql(context,(RenameCtx *)local_208,zSql,zNew,1);
  }
  if (iVar5 != 0) {
    if ((iVar5 == 1) && ((db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(context,argv[3]);
    }
    else if (local_1e0.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(context,iVar5);
    }
    else {
      renameColumnParseError(context,"",argv[1],argv[2],&local_1e0);
    }
  }
  renameParseCleanup(&local_1e0);
  auVar15 = local_208;
  while (auVar15 != (undefined1  [8])0x0) {
    pRVar9 = ((RenameToken *)auVar15)->pNext;
    sqlite3DbFreeNN(db,(void *)auVar15);
    auVar15 = (undefined1  [8])pRVar9;
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->xAuth = p_Var4;
LAB_001b3084:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( IsView(pTab) ){
          if( isLegacy==0 ){
            Select *pSelect = pTab->u.view.pSelect;
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            assert( pSelect->selFlags & SF_View );
            pSelect->selFlags &= ~SF_View;
            sqlite3SelectPrep(&sParse, pTab->u.view.pSelect, &sNC);
            if( sParse.nErr ){
              rc = sParse.rc;
            }else{
              sqlite3WalkSelect(&sWalker, pTab->u.view.pSelect);
            }
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( (isLegacy==0 || (db->flags & SQLITE_ForeignKeys))
           && !IsVirtual(pTab)
          ){
            FKey *pFKey;
            assert( IsOrdinaryTable(pTab) );
            for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld)
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
              if( pStep->pFrom ){
                int i;
                for(i=0; i<pStep->pFrom->nSrc; i++){
                  SrcItem *pItem = &pStep->pFrom->a[i];
                  if( 0==sqlite3_stricmp(pItem->zName, zOld) ){
                    renameTokenFind(&sParse, &sCtx, pItem->zName);
                  }
                }
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
        sqlite3_result_value(context, argv[3]);
      }else if( sParse.zErrMsg ){
        renameColumnParseError(context, "", argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}